

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O3

int qc_socket_nagle_onoff(QcSocket *socket,int onoff)

{
  int iVar1;
  int iVar2;
  int *__ptr;
  ssize_t sVar3;
  uint extraout_EDX;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  ulong unaff_RBX;
  undefined4 in_register_00000034;
  char *__cp;
  QcSocket *pQVar4;
  char *unaff_R14;
  int flag;
  sockaddr sStack_a8;
  ulong uStack_98;
  socklen_t sStack_74;
  sockaddr sStack_70;
  ulong uStack_60;
  code *pcStack_58;
  code *pcStack_50;
  sockaddr sStack_40;
  undefined1 local_4 [4];
  
  __cp = (char *)CONCAT44(in_register_00000034,onoff);
  if (socket != (QcSocket *)0x0) {
    iVar1 = setsockopt(socket->sockfd,6,1,local_4,4);
    iVar2 = 0;
    if (iVar1 == -1) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x6b,"couldn\'t setsockopt(TCP_NODELAY)\n");
      iVar2 = -1;
    }
    return iVar2;
  }
  qc_socket_nagle_onoff_cold_1();
  if (socket != (QcSocket *)0x0) {
    return socket->sockfd;
  }
  qc_socket_getfd_cold_1();
  if (socket == (QcSocket *)0x0) {
    pcStack_50 = (code *)0x109a8d;
    qc_tcp_bind_cold_3();
LAB_00109a8d:
    pcStack_50 = (code *)0x109a92;
    qc_tcp_bind_cold_2();
  }
  else {
    unaff_R14 = __cp;
    if (__cp == (char *)0x0) goto LAB_00109a8d;
    unaff_RBX = (ulong)extraout_EDX;
    if (0 < (int)extraout_EDX) {
      sStack_40.sa_family = 2;
      sStack_40.sa_data._0_2_ = (ushort)extraout_EDX << 8 | (ushort)extraout_EDX >> 8;
      pcStack_50 = (code *)0x109a28;
      iVar1 = strcmp(__cp,"127.0.0.1");
      iVar2 = 0;
      sStack_40.sa_data._2_4_ = 0;
      if (iVar1 != 0) {
        pcStack_50 = (code *)0x109a3d;
        sStack_40.sa_data._2_4_ = inet_addr(__cp);
      }
      pcStack_50 = (code *)0x109a52;
      iVar1 = bind(socket->sockfd,&sStack_40,0x10);
      if (iVar1 != 0) {
        pcStack_50 = (code *)0x109a76;
        _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                   ,0x8d,"socket bind failed (ip=%s port=%d)",__cp,(ulong)extraout_EDX);
        iVar2 = -1;
      }
      return iVar2;
    }
  }
  pcStack_50 = qc_tcp_listen;
  qc_tcp_bind_cold_1();
  if (socket != (QcSocket *)0x0) {
    pcStack_58 = (code *)0x109aa9;
    iVar1 = listen(socket->sockfd,0x1000);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      pcStack_58 = (code *)0x109ac5;
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x9b,"socket listen failed");
      iVar1 = -1;
    }
    return iVar1;
  }
  pcStack_58 = qc_tcp_accept;
  qc_tcp_listen_cold_1();
  uStack_60 = unaff_RBX;
  pcStack_58 = (code *)unaff_R14;
  if (socket == (QcSocket *)0x0) {
    qc_tcp_accept_cold_2();
    pQVar4 = socket;
  }
  else {
    pQVar4 = (QcSocket *)0x4;
    __ptr = (int *)malloc(4);
    if (__ptr != (int *)0x0) {
      sStack_74 = 0x10;
      iVar1 = accept(socket->sockfd,&sStack_70,&sStack_74);
      *__ptr = iVar1;
      if (iVar1 < 0) {
        _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0xb2,"socket accept failed");
        free(__ptr);
        __ptr = (int *)0x0;
      }
      return (int)__ptr;
    }
  }
  qc_tcp_accept_cold_1();
  uStack_98 = unaff_RBX;
  if (pQVar4 == (QcSocket *)0x0) {
    qc_tcp_connect_cold_3();
  }
  else if (__cp != (char *)0x0) {
    if (0 < (int)extraout_EDX_00) {
      sStack_a8.sa_family = 2;
      sStack_a8.sa_data._0_2_ = (ushort)extraout_EDX_00 << 8 | (ushort)extraout_EDX_00 >> 8;
      sStack_a8.sa_data._2_4_ = inet_addr(__cp);
      iVar1 = connect(pQVar4->sockfd,&sStack_a8,0x10);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                   ,0xc9,"tcp connect failed (ip=%s, port=%d)",__cp,(ulong)extraout_EDX_00);
        iVar1 = -1;
      }
      return iVar1;
    }
    goto LAB_00109be4;
  }
  qc_tcp_connect_cold_2();
LAB_00109be4:
  qc_tcp_connect_cold_1();
  sVar3 = send(pQVar4->sockfd,__cp,(long)extraout_EDX_01,0x4000);
  return (int)sVar3;
}

Assistant:

int qc_socket_nagle_onoff(QcSocket *socket, int onoff)
{
    int flag, ret;

    qc_assert(socket);

    flag = onoff;
    ret = setsockopt(socket->sockfd, IPPROTO_TCP, TCP_NODELAY, (char *)&flag, sizeof(flag));

    if(ret == -1){
        qc_error("couldn't setsockopt(TCP_NODELAY)\n");
        return -1;
    }

    return 0;
}